

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.cpp
# Opt level: O0

optional<jhu::thrax::(anonymous_namespace)::Concat> *
jhu::thrax::anon_unknown_0::concatenation
          (optional<jhu::thrax::(anonymous_namespace)::Concat> *__return_storage_ptr__,Tree *tree,
          Span nt)

{
  vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> *tree_00;
  bool bVar1;
  type *ptVar2;
  type *__rhs;
  pointer pNVar3;
  Constituent *pCVar4;
  Concat local_b8;
  Span local_94;
  undefined1 local_90 [8];
  optional<jhu::thrax::(anonymous_namespace)::Constituent> b;
  type it;
  type *e;
  type *s;
  Span local_58 [2];
  basic_string_view<char,_std::char_traits<char>_> bStack_50;
  undefined8 local_40;
  Node *local_38;
  Node *local_30;
  pair<__gnu_cxx::__normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>,___gnu_cxx::__normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>_>
  local_28;
  vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> *local_18;
  Tree *tree_local;
  Span nt_local;
  
  local_18 = tree;
  tree_local._4_4_ = nt;
  local_30 = (Node *)std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::begin(tree);
  local_38 = (Node *)std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::end(local_18)
  ;
  local_58[0] = tree_local._4_4_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&bStack_50);
  local_40 = 0;
  local_28 = std::
             equal_range<__gnu_cxx::__normal_iterator<jhu::thrax::Node_const*,std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>>,jhu::thrax::Node,jhu::thrax::(anonymous_namespace)::__1>
                       (local_30,local_38,local_58);
  ptVar2 = std::
           get<0ul,__gnu_cxx::__normal_iterator<jhu::thrax::Node_const*,std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>>,__gnu_cxx::__normal_iterator<jhu::thrax::Node_const*,std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>>>
                     (&local_28);
  __rhs = std::
          get<1ul,__gnu_cxx::__normal_iterator<jhu::thrax::Node_const*,std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>>,__gnu_cxx::__normal_iterator<jhu::thrax::Node_const*,std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>>>
                    (&local_28);
  b.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>._M_payload.
  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>._16_8_ =
       ptVar2->_M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>
                        *)&b.
                           super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                           ._M_engaged,__rhs);
    tree_00 = local_18;
    if (!bVar1) {
      std::optional<jhu::thrax::(anonymous_namespace)::Concat>::optional(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    pNVar3 = __gnu_cxx::
             __normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>
             ::operator->((__normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>
                           *)&b.
                              super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                              ._M_engaged);
    local_94.end = tree_local._6_2_;
    local_94.start = (pNVar3->span).end;
    constituent((optional<jhu::thrax::(anonymous_namespace)::Constituent> *)local_90,tree_00,
                local_94);
    bVar1 = std::optional<jhu::thrax::(anonymous_namespace)::Constituent>::has_value
                      ((optional<jhu::thrax::(anonymous_namespace)::Constituent> *)local_90);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>
    ::operator++((__normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>
                  *)&b.
                     super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
                     _M_engaged,0);
  }
  pNVar3 = __gnu_cxx::
           __normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>
           ::operator->((__normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>
                         *)&b.
                            super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                            ._M_engaged);
  local_b8.a._M_len = (pNVar3->label)._M_len;
  local_b8.a._M_str = (pNVar3->label)._M_str;
  pCVar4 = std::optional<jhu::thrax::(anonymous_namespace)::Constituent>::operator->
                     ((optional<jhu::thrax::(anonymous_namespace)::Constituent> *)local_90);
  local_b8.b._M_len = (pCVar4->label)._M_len;
  local_b8.b._M_str = (pCVar4->label)._M_str;
  std::optional<jhu::thrax::(anonymous_namespace)::Concat>::
  optional<jhu::thrax::(anonymous_namespace)::Concat,_true>(__return_storage_ptr__,&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Concat> concatenation(const Tree& tree, Span nt) {
  auto [s, e] = std::equal_range(
      tree.begin(), tree.end(), Node{ nt, {}, nullptr }, byStart);
  for (auto it = s; it < e; it++) {
    auto b = constituent(tree, Span{ it->span.end, nt.end });
    if (b.has_value()) {
      return Concat{ it->label, b->label };
    }
  }
  return {};
}